

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

void cmRST::UnindentLines
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *lines)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pointer pbVar8;
  pointer pbVar9;
  string *this;
  pointer pbVar10;
  string indentText;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  long local_48;
  pointer local_40;
  pointer local_38;
  
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  pbVar10 = (lines->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar8 - (long)pbVar10)) {
    uVar6 = 1;
    bVar2 = true;
    uVar3 = 0;
    do {
      uVar1 = pbVar10[uVar6]._M_string_length;
      uVar5 = uVar3;
      if (uVar1 != 0) {
        pbVar9 = pbVar10 + uVar6;
        if (bVar2) {
          uVar3 = std::__cxx11::string::find_first_not_of((char *)pbVar9,0x49eaf0,0);
          std::__cxx11::string::substr((ulong)&local_88,(ulong)pbVar9);
          std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
          if (local_88 != &local_78) {
            operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
          }
          pbVar10 = (lines->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar8 = (lines->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
LAB_00153946:
          bVar2 = false;
          uVar5 = uVar3;
        }
        else {
          uVar5 = uVar1;
          if (uVar3 <= uVar1) {
            uVar5 = uVar3;
          }
          if (uVar3 != 0) {
            uVar3 = 0;
            do {
              if ((pbVar9->_M_dataplus)._M_p[uVar3] != local_68[uVar3]) goto LAB_00153946;
              uVar3 = uVar3 + 1;
            } while (uVar5 != uVar3);
          }
          bVar2 = false;
        }
      }
      uVar6 = uVar6 + 1;
      uVar3 = uVar5;
    } while (uVar6 < (ulong)((long)pbVar8 - (long)pbVar10 >> 5));
    if (0x20 < (ulong)((long)pbVar8 - (long)pbVar10)) {
      uVar3 = 1;
      lVar7 = 0x20;
      do {
        if (*(long *)((long)&pbVar10->_M_string_length + lVar7) != 0) {
          this = (string *)((long)&(pbVar10->_M_dataplus)._M_p + lVar7);
          std::__cxx11::string::substr((ulong)&local_88,(ulong)this);
          std::__cxx11::string::operator=(this,(string *)&local_88);
          if (local_88 != &local_78) {
            operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
          }
          pbVar10 = (lines->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar8 = (lines->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar3 = uVar3 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar3 < (ulong)((long)pbVar8 - (long)pbVar10 >> 5));
    }
  }
  local_80 = 0;
  local_78 = 0;
  local_88 = &local_78;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<cmFindNot<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>>
                    (pbVar10);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  local_40 = (lines->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = 0;
  local_78 = 0;
  local_88 = &local_78;
  local_38 = pbVar8;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_pred<cmFindNot<cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>,std::__cxx11::string>(cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>>
            (&local_48);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  pbVar9 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)_Var4._M_current + ((long)pbVar9 - (long)pbVar10);
  pbVar10 = (lines->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish + -((long)pbVar8 - local_48 >> 5);
  std::_V2::
  __rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (pbVar9,lVar7,pbVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(lines,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)pbVar10 + ((long)pbVar9 - lVar7)),
             (lines->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

void cmRST::UnindentLines(std::vector<std::string>& lines)
{
  // Remove the common indentation from the second and later lines.
  std::string indentText;
  std::string::size_type indentEnd = 0;
  bool first = true;
  for (size_t i = 1; i < lines.size(); ++i) {
    std::string const& line = lines[i];

    // Do not consider empty lines.
    if (line.empty()) {
      continue;
    }

    // Record indentation on first non-empty line.
    if (first) {
      first = false;
      indentEnd = line.find_first_not_of(" \t");
      indentText = line.substr(0, indentEnd);
      continue;
    }

    // Truncate indentation to match that on this line.
    indentEnd = std::min(indentEnd, line.size());
    for (std::string::size_type j = 0; j != indentEnd; ++j) {
      if (line[j] != indentText[j]) {
        indentEnd = j;
        break;
      }
    }
  }

  // Update second and later lines.
  for (size_t i = 1; i < lines.size(); ++i) {
    std::string& line = lines[i];
    if (!line.empty()) {
      line = line.substr(indentEnd);
    }
  }

  std::vector<std::string>::const_iterator it = lines.begin();
  size_t leadingEmpty = std::distance(it, cmFindNot(lines, std::string()));

  std::vector<std::string>::const_reverse_iterator rit = lines.rbegin();
  size_t trailingEmpty =
    std::distance(rit, cmFindNot(cmReverseRange(lines), std::string()));

  std::vector<std::string>::iterator contentEnd = cmRotate(
    lines.begin(), lines.begin() + leadingEmpty, lines.end() - trailingEmpty);
  lines.erase(contentEnd, lines.end());
}